

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bip324.cpp
# Opt level: O0

void __thiscall
BIP324Cipher::Initialize
          (BIP324Cipher *this,EllSwiftPubKey *their_pubkey,bool initiator,bool self_decrypt)

{
  iterator pvVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  char *__s;
  allocator<char> *__a;
  string *info;
  CKey *this_00;
  byte in_DL;
  long in_RDI;
  long in_FS_OFFSET;
  bool side;
  MessageStartChars *message_header;
  array<std::byte,_32UL> hkdf_32_okm;
  CHKDF_HMAC_SHA256_L32 hkdf;
  ECDHSecret ecdh_secret;
  string salt;
  CChainParams *in_stack_fffffffffffffd18;
  CKey *pCVar3;
  byte *in_stack_fffffffffffffd28;
  string *in_stack_fffffffffffffd30;
  optional<FSChaCha20> *in_stack_fffffffffffffd38;
  CHKDF_HMAC_SHA256_L32 *this_01;
  uchar *in_stack_fffffffffffffd40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd50;
  allocator<char> *in_stack_fffffffffffffd58;
  char *in_stack_fffffffffffffd60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd68;
  undefined8 in_stack_fffffffffffffd70;
  undefined1 initiating;
  EllSwiftPubKey *in_stack_fffffffffffffd78;
  EllSwiftPubKey *in_stack_fffffffffffffd80;
  CKey *in_stack_fffffffffffffd88;
  undefined1 local_1a8 [24];
  CHKDF_HMAC_SHA256_L32 local_190 [8];
  CKey local_88 [8];
  long local_8;
  
  initiating = (undefined1)((ulong)in_stack_fffffffffffffd70 >> 0x38);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  Params();
  CChainParams::MessageStart(in_stack_fffffffffffffd18);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffd68,in_stack_fffffffffffffd60,in_stack_fffffffffffffd58);
  std::begin<std::array<unsigned_char,4ul>>((array<unsigned_char,_4UL> *)in_stack_fffffffffffffd18);
  std::end<std::array<unsigned_char,4ul>>((array<unsigned_char,_4UL> *)in_stack_fffffffffffffd18);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<unsigned_char_const*,void>
            (in_stack_fffffffffffffd48,in_stack_fffffffffffffd40,(uchar *)in_stack_fffffffffffffd38,
             (allocator<char> *)in_stack_fffffffffffffd30);
  std::operator+(in_stack_fffffffffffffd50,in_stack_fffffffffffffd48);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffd18);
  std::allocator<char>::~allocator((allocator<char> *)(local_190[0].m_prk + 6));
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffd18);
  std::allocator<char>::~allocator((allocator<char> *)(local_190[0].m_prk + 7));
  CKey::ComputeBIP324ECDHSecret
            (in_stack_fffffffffffffd88,in_stack_fffffffffffffd80,in_stack_fffffffffffffd78,
             (bool)initiating);
  std::array<std::byte,_32UL>::data((array<std::byte,_32UL> *)in_stack_fffffffffffffd18);
  UCharCast((byte *)in_stack_fffffffffffffd18);
  std::array<std::byte,_32UL>::size((array<std::byte,_32UL> *)in_stack_fffffffffffffd18);
  CHKDF_HMAC_SHA256_L32::CHKDF_HMAC_SHA256_L32
            ((CHKDF_HMAC_SHA256_L32 *)in_stack_fffffffffffffd48,in_stack_fffffffffffffd40,
             (size_t)in_stack_fffffffffffffd38,in_stack_fffffffffffffd30);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffd68,in_stack_fffffffffffffd60,in_stack_fffffffffffffd58);
  std::array<std::byte,_32UL>::data((array<std::byte,_32UL> *)in_stack_fffffffffffffd18);
  UCharCast((byte *)in_stack_fffffffffffffd18);
  CHKDF_HMAC_SHA256_L32::Expand32
            ((CHKDF_HMAC_SHA256_L32 *)in_stack_fffffffffffffd38,in_stack_fffffffffffffd30,
             in_stack_fffffffffffffd28);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffd18);
  std::allocator<char>::~allocator((allocator<char> *)(local_190[0].m_prk + 5));
  std::optional<FSChaCha20>::emplace<std::array<std::byte,32ul>&,unsigned_int_const&>
            (in_stack_fffffffffffffd38,(array<std::byte,_32UL> *)in_stack_fffffffffffffd30,
             (uint *)in_stack_fffffffffffffd28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffd68,in_stack_fffffffffffffd60,in_stack_fffffffffffffd58);
  std::array<std::byte,_32UL>::data((array<std::byte,_32UL> *)in_stack_fffffffffffffd18);
  UCharCast((byte *)in_stack_fffffffffffffd18);
  CHKDF_HMAC_SHA256_L32::Expand32
            ((CHKDF_HMAC_SHA256_L32 *)in_stack_fffffffffffffd38,in_stack_fffffffffffffd30,
             in_stack_fffffffffffffd28);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffd18);
  std::allocator<char>::~allocator((allocator<char> *)(local_190[0].m_prk + 4));
  std::optional<FSChaCha20Poly1305>::emplace<std::array<std::byte,32ul>&,unsigned_int_const&>
            ((optional<FSChaCha20Poly1305> *)in_stack_fffffffffffffd38,
             (array<std::byte,_32UL> *)in_stack_fffffffffffffd30,(uint *)in_stack_fffffffffffffd28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffd68,in_stack_fffffffffffffd60,in_stack_fffffffffffffd58);
  std::array<std::byte,_32UL>::data((array<std::byte,_32UL> *)in_stack_fffffffffffffd18);
  UCharCast((byte *)in_stack_fffffffffffffd18);
  CHKDF_HMAC_SHA256_L32::Expand32
            ((CHKDF_HMAC_SHA256_L32 *)in_stack_fffffffffffffd38,in_stack_fffffffffffffd30,
             in_stack_fffffffffffffd28);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffd18);
  std::allocator<char>::~allocator((allocator<char> *)(local_190[0].m_prk + 3));
  std::optional<FSChaCha20>::emplace<std::array<std::byte,32ul>&,unsigned_int_const&>
            (in_stack_fffffffffffffd38,(array<std::byte,_32UL> *)in_stack_fffffffffffffd30,
             (uint *)in_stack_fffffffffffffd28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffd68,in_stack_fffffffffffffd60,in_stack_fffffffffffffd58);
  std::array<std::byte,_32UL>::data((array<std::byte,_32UL> *)in_stack_fffffffffffffd18);
  UCharCast((byte *)in_stack_fffffffffffffd18);
  CHKDF_HMAC_SHA256_L32::Expand32
            ((CHKDF_HMAC_SHA256_L32 *)in_stack_fffffffffffffd38,in_stack_fffffffffffffd30,
             in_stack_fffffffffffffd28);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffd18);
  std::allocator<char>::~allocator((allocator<char> *)(local_190[0].m_prk + 2));
  std::optional<FSChaCha20Poly1305>::emplace<std::array<std::byte,32ul>&,unsigned_int_const&>
            ((optional<FSChaCha20Poly1305> *)in_stack_fffffffffffffd38,
             (array<std::byte,_32UL> *)in_stack_fffffffffffffd30,(uint *)in_stack_fffffffffffffd28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffd68,in_stack_fffffffffffffd60,in_stack_fffffffffffffd58);
  std::array<std::byte,_32UL>::data((array<std::byte,_32UL> *)in_stack_fffffffffffffd18);
  UCharCast((byte *)in_stack_fffffffffffffd18);
  CHKDF_HMAC_SHA256_L32::Expand32
            ((CHKDF_HMAC_SHA256_L32 *)in_stack_fffffffffffffd38,in_stack_fffffffffffffd30,
             in_stack_fffffffffffffd28);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffd18);
  std::allocator<char>::~allocator((allocator<char> *)(local_190[0].m_prk + 1));
  std::begin<std::array<std::byte,32ul>>((array<std::byte,_32UL> *)in_stack_fffffffffffffd18);
  pvVar1 = std::begin<std::array<std::byte,32ul>>
                     ((array<std::byte,_32UL> *)in_stack_fffffffffffffd18);
  pbVar2 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(pvVar1 + 0x10);
  if ((in_DL & 1) == 0) {
    __s = (char *)(in_RDI + 0x2c0);
  }
  else {
    __s = (char *)(in_RDI + 0x2b0);
  }
  std::array<std::byte,_16UL>::begin((array<std::byte,_16UL> *)in_stack_fffffffffffffd18);
  std::copy<std::byte*,std::byte*>
            ((byte *)in_stack_fffffffffffffd38,(byte *)in_stack_fffffffffffffd30,
             in_stack_fffffffffffffd28);
  __a = (allocator<char> *)
        std::end<std::array<std::byte,32ul>>((array<std::byte,_32UL> *)in_stack_fffffffffffffd18);
  std::end<std::array<std::byte,32ul>>((array<std::byte,_32UL> *)in_stack_fffffffffffffd18);
  std::array<std::byte,_16UL>::begin((array<std::byte,_16UL> *)in_stack_fffffffffffffd18);
  std::copy<std::byte*,std::byte*>
            ((byte *)in_stack_fffffffffffffd38,(byte *)in_stack_fffffffffffffd30,
             in_stack_fffffffffffffd28);
  this_01 = local_190;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(pbVar2,__s,__a);
  std::array<std::byte,_32UL>::data((array<std::byte,_32UL> *)in_stack_fffffffffffffd18);
  info = (string *)UCharCast((byte *)in_stack_fffffffffffffd18);
  CHKDF_HMAC_SHA256_L32::Expand32(this_01,info,in_stack_fffffffffffffd28);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffd18);
  std::allocator<char>::~allocator((allocator<char> *)local_190);
  pCVar3 = local_88;
  this_00 = (CKey *)std::array<std::byte,_32UL>::data
                              ((array<std::byte,_32UL> *)in_stack_fffffffffffffd18);
  std::array<std::byte,_32UL>::size((array<std::byte,_32UL> *)in_stack_fffffffffffffd18);
  memory_cleanse(in_stack_fffffffffffffd18,0x8b6442);
  std::array<std::byte,_32UL>::data((array<std::byte,_32UL> *)in_stack_fffffffffffffd18);
  memory_cleanse(in_stack_fffffffffffffd18,0x8b645e);
  memory_cleanse(in_stack_fffffffffffffd18,0x8b6472);
  local_1a8._0_8_ = (pointer)0x0;
  local_1a8._8_8_ = 0;
  pbVar2 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8;
  CKey::CKey((CKey *)pbVar2);
  CKey::operator=(this_00,pCVar3);
  CKey::~CKey((CKey *)pbVar2);
  std::__cxx11::string::~string(pbVar2);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void BIP324Cipher::Initialize(const EllSwiftPubKey& their_pubkey, bool initiator, bool self_decrypt) noexcept
{
    // Determine salt (fixed string + network magic bytes)
    const auto& message_header = Params().MessageStart();
    std::string salt = std::string{"bitcoin_v2_shared_secret"} + std::string(std::begin(message_header), std::end(message_header));

    // Perform ECDH to derive shared secret.
    ECDHSecret ecdh_secret = m_key.ComputeBIP324ECDHSecret(their_pubkey, m_our_pubkey, initiator);

    // Derive encryption keys from shared secret, and initialize stream ciphers and AEADs.
    bool side = (initiator != self_decrypt);
    CHKDF_HMAC_SHA256_L32 hkdf(UCharCast(ecdh_secret.data()), ecdh_secret.size(), salt);
    std::array<std::byte, 32> hkdf_32_okm;
    hkdf.Expand32("initiator_L", UCharCast(hkdf_32_okm.data()));
    (side ? m_send_l_cipher : m_recv_l_cipher).emplace(hkdf_32_okm, REKEY_INTERVAL);
    hkdf.Expand32("initiator_P", UCharCast(hkdf_32_okm.data()));
    (side ? m_send_p_cipher : m_recv_p_cipher).emplace(hkdf_32_okm, REKEY_INTERVAL);
    hkdf.Expand32("responder_L", UCharCast(hkdf_32_okm.data()));
    (side ? m_recv_l_cipher : m_send_l_cipher).emplace(hkdf_32_okm, REKEY_INTERVAL);
    hkdf.Expand32("responder_P", UCharCast(hkdf_32_okm.data()));
    (side ? m_recv_p_cipher : m_send_p_cipher).emplace(hkdf_32_okm, REKEY_INTERVAL);

    // Derive garbage terminators from shared secret.
    hkdf.Expand32("garbage_terminators", UCharCast(hkdf_32_okm.data()));
    std::copy(std::begin(hkdf_32_okm), std::begin(hkdf_32_okm) + GARBAGE_TERMINATOR_LEN,
        (initiator ? m_send_garbage_terminator : m_recv_garbage_terminator).begin());
    std::copy(std::end(hkdf_32_okm) - GARBAGE_TERMINATOR_LEN, std::end(hkdf_32_okm),
        (initiator ? m_recv_garbage_terminator : m_send_garbage_terminator).begin());

    // Derive session id from shared secret.
    hkdf.Expand32("session_id", UCharCast(m_session_id.data()));

    // Wipe all variables that contain information which could be used to re-derive encryption keys.
    memory_cleanse(ecdh_secret.data(), ecdh_secret.size());
    memory_cleanse(hkdf_32_okm.data(), sizeof(hkdf_32_okm));
    memory_cleanse(&hkdf, sizeof(hkdf));
    m_key = CKey();
}